

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateJavascriptState
          (HtmlparserCppTest *this,string *expected_state)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t __n;
  int iVar2;
  HtmlparserCppTest *pHVar3;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar4;
  HtmlParser *this_00;
  const_iterator cVar5;
  mapped_type *ppHVar6;
  undefined8 extraout_RAX_02;
  undefined1 *puVar7;
  HtmlparserCppTest *pHVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  pointer this_01;
  _Base_ptr unaff_R12;
  _Base_ptr unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  bool bVar11;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_128;
  _Base_ptr p_Stack_110;
  _Base_ptr p_Stack_108;
  undefined1 auStack_c8 [16];
  _Base_ptr p_Stack_b8;
  _Base_ptr p_Stack_b0;
  _Base_ptr p_Stack_a8;
  undefined1 auStack_a0 [16];
  _Base_ptr p_Stack_90;
  _Base_ptr p_Stack_88;
  _Base_ptr p_Stack_80;
  char *pcStack_78;
  HtmlParser HStack_70;
  allocator local_31;
  HtmlparserCppTest *local_30;
  size_t local_28;
  
  pHVar8 = (HtmlparserCppTest *)(this->parser_).parser_;
  iVar2 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar8);
  puVar7 = kJavascriptStateMap;
  pHVar3 = (HtmlparserCppTest *)IdToName(pHVar8,(IdNameMap *)kJavascriptStateMap,iVar2);
  if (expected_state->_M_string_length == 0) {
    ValidateJavascriptState();
  }
  else {
    unaff_R14 = (_Base_ptr)&local_30;
    std::__cxx11::string::string((string *)unaff_R14,(char *)pHVar3,&local_31);
    __n = expected_state->_M_string_length;
    puVar7 = (undefined1 *)pHVar3;
    if (__n == local_28) {
      if (__n == 0) {
        bVar11 = true;
      }
      else {
        puVar7 = (undefined1 *)local_30;
        iVar2 = bcmp((expected_state->_M_dataplus)._M_p,local_30,__n);
        bVar11 = iVar2 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if (local_30 != (HtmlparserCppTest *)&stack0xffffffffffffffe0) {
      operator_delete(local_30);
    }
    pHVar8 = local_30;
    if (bVar11) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar11 = StringToBool((string *)puVar7);
  p_Var9 = (_Base_ptr)(pHVar8->parser_).parser_;
  iVar2 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)p_Var9);
  if (bVar11 == (iVar2 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar3 = (HtmlparserCppTest *)&pcStack_78;
  HStack_70.parser_ = (htmlparser_ctx *)pHVar8;
  if (*(long *)&(((HtmlparserCppTest *)puVar7)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar11 = false;
    p_Var10 = p_Var9;
  }
  else {
    p_Stack_80 = (_Base_ptr)0x1072b8;
    pcStack_78 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var10 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar7)->contextMap)._M_t._M_impl;
    p_Stack_80 = (_Base_ptr)0x1072d4;
    unaff_R14 = (_Base_ptr)strtol((char *)p_Var10,&pcStack_78,10);
    puVar7 = (undefined1 *)pHVar3;
    if (*pcStack_78 == '\0') {
      bVar11 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)&pcStack_78;
    }
    else {
      bVar11 = false;
      unaff_R12 = (_Base_ptr)&pcStack_78;
    }
  }
  if (bVar11) {
    p_Var10 = p_Var9[1]._M_left;
    p_Stack_80 = (_Base_ptr)0x1072fc;
    iVar2 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)p_Var10);
    if ((int)unaff_R14 == iVar2) {
      return;
    }
  }
  else {
    p_Stack_80 = (_Base_ptr)0x107312;
    ValidateLine();
  }
  p_Stack_80 = (_Base_ptr)0x107317;
  ValidateLine();
  pHVar8 = (HtmlparserCppTest *)auStack_a0;
  auStack_a0._8_8_ = p_Var9;
  p_Stack_90 = unaff_R12;
  p_Stack_88 = unaff_R14;
  p_Stack_80 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar7)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar11 = false;
    p_Var9 = p_Var10;
  }
  else {
    p_Stack_a8 = (_Base_ptr)0x107332;
    auStack_a0._0_8_ = extraout_RAX_00;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var9 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar7)->contextMap)._M_t._M_impl;
    p_Stack_a8 = (_Base_ptr)0x10734e;
    unaff_R14 = (_Base_ptr)strtol((char *)p_Var9,(char **)auStack_a0,10);
    puVar7 = (undefined1 *)pHVar8;
    if (*(char *)auStack_a0._0_8_ == '\0') {
      bVar11 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)auStack_a0;
    }
    else {
      bVar11 = false;
      unaff_R12 = (_Base_ptr)auStack_a0;
    }
  }
  if (bVar11) {
    p_Var9 = p_Var10[1]._M_left;
    p_Stack_a8 = (_Base_ptr)0x107376;
    iVar2 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)p_Var9);
    if ((int)unaff_R14 == iVar2) {
      return;
    }
  }
  else {
    p_Stack_a8 = (_Base_ptr)0x10738c;
    ValidateColumn();
  }
  p_Stack_a8 = (_Base_ptr)0x107391;
  ValidateColumn();
  pHVar8 = (HtmlparserCppTest *)auStack_c8;
  auStack_c8._8_8_ = p_Var10;
  p_Stack_b8 = unaff_R12;
  p_Stack_b0 = unaff_R14;
  p_Stack_a8 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar7)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar11 = false;
    p_Var10 = p_Var9;
  }
  else {
    auStack_c8._0_8_ = extraout_RAX_01;
    piVar4 = __errno_location();
    *piVar4 = 0;
    p_Var10 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar7)->contextMap)._M_t._M_impl;
    unaff_R14 = (_Base_ptr)strtol((char *)p_Var10,(char **)auStack_c8,10);
    puVar7 = (undefined1 *)pHVar8;
    if (*(char *)auStack_c8._0_8_ == '\0') {
      bVar11 = *piVar4 == 0;
      unaff_R12 = (_Base_ptr)auStack_c8;
    }
    else {
      bVar11 = false;
      unaff_R12 = (_Base_ptr)auStack_c8;
    }
  }
  if (bVar11) {
    p_Var10 = p_Var9[1]._M_left;
    iVar2 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)p_Var10);
    if ((int)unaff_R14 == iVar2) {
      return;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar11 = StringToBool((string *)puVar7);
  pHVar8 = (HtmlparserCppTest *)p_Var10[1]._M_left;
  iVar2 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar8);
  if (bVar11 == (iVar2 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_128.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_128.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_128.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Stack_110 = p_Var10;
  p_Stack_108 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)puVar7,"=",",",&vStack_128);
  if (vStack_128.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_128.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar8->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_128.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar2 = std::__cxx11::string::compare((char *)str_00);
      if (iVar2 == 0) {
        ValidateState(pHVar8,str);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)str_00);
        if (iVar2 == 0) {
          ValidateTag(pHVar8,str);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)str_00);
          if (iVar2 == 0) {
            ValidateAttribute(pHVar8,str);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)str_00);
            if (iVar2 == 0) {
              ValidateValue(pHVar8,str);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)str_00);
              if (iVar2 == 0) {
                ValidateAttributeType(pHVar8,str);
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)str_00);
                if (iVar2 == 0) {
                  ValidateAttributeQuoted(pHVar8,str);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar2 == 0) {
                    ValidateInJavascript(pHVar8,str);
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar2 == 0) {
                      ValidateJavascriptQuoted(pHVar8,str);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar2 == 0) {
                        ValidateJavascriptState(pHVar8,str);
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar2 == 0) {
                          ValidateInCss(pHVar8,str);
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar2 == 0) {
                            ValidateLine(pHVar8,str);
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar2 == 0) {
                              ValidateColumn(pHVar8,str);
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar2 == 0) {
                                ValidateValueIndex(pHVar8,str);
                              }
                              else {
                                iVar2 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar2 == 0) {
                                  ValidateIsUrlStart(pHVar8,str);
                                }
                                else {
                                  iVar2 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar2 == 0) {
                                    cVar5 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar8,str);
                                    if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar6 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar8->contextMap,str);
                                      *ppHVar6 = this_00;
                                    }
                                    ppHVar6 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&pHVar8->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar6,&pHVar8->parser_);
                                  }
                                  else {
                                    iVar2 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar2 == 0) {
                                      cVar5 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar8,str);
                                      if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_128);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar6 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar8->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar8->parser_,*ppHVar6);
                                    }
                                    else {
                                      iVar2 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar2 == 0) {
                                        bVar11 = StringToBool(str);
                                        if (bVar11) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar8->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar2 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar2 == 0) {
                                          iVar2 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar8->parser_).parser_,iVar2);
                                        }
                                        else {
                                          iVar2 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar2 != 0) goto LAB_0010784b;
                                          bVar11 = StringToBool(str);
                                          if (bVar11) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar8->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_128.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_128);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateJavascriptState(const string &expected_state) {
  const char* parsed_state = IdToName(kJavascriptStateMap,
                                      parser_.javascript_state());
  EXPECT_TRUE(parsed_state != NULL);
  EXPECT_TRUE(!expected_state.empty());
  EXPECT_EQ(expected_state, string(parsed_state))
      << "Unexpected javascript state at line " << parser_.line_number();
}